

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O3

void __thiscall
soplex::SPxBasisBase<double>::change
          (SPxBasisBase<double> *this,int i,SPxId *id,SVectorBase<double> *enterVec,
          SSVectorBase<double> *eta)

{
  SVectorBase<double> **ppSVar1;
  SPxId *pSVar2;
  char cVar3;
  int iVar4;
  SPxOut *pSVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar6;
  Verbosity old_verbosity;
  Verbosity local_30 [2];
  double local_28;
  
  this->lastidx = i;
  (this->lastin).super_DataKey = id->super_DataKey;
  if ((i < 0) || ((id->super_DataKey).info == 0)) {
    (this->lastout).super_DataKey = id->super_DataKey;
    return;
  }
  ppSVar1 = (this->matrix).data;
  this->nzCount = (this->nzCount - ppSVar1[(uint)i]->memused) + enterVec->memused;
  ppSVar1[(uint)i] = enterVec;
  pSVar2 = (this->theBaseId).data;
  (this->lastout).super_DataKey = pSVar2[(uint)i].super_DataKey;
  pSVar2[(uint)i].super_DataKey = id->super_DataKey;
  this->iterCount = this->iterCount + 1;
  this->updateCount = this->updateCount + 1;
  (*this->factor->_vptr_SLinSolver[3])();
  (*this->theLP->theTime->_vptr_Timer[6])();
  if (this->factorized == false) {
    (*this->_vptr_SPxBasisBase[0xb])(this);
    return;
  }
  iVar4 = (*this->factor->_vptr_SLinSolver[3])();
  local_28 = (double)iVar4;
  iVar4 = (*this->factor->_vptr_SLinSolver[4])();
  if (local_28 <= (double)this->lastMem * this->memFactor + (double)(iVar4 + 1000)) {
    iVar4 = (*this->factor->_vptr_SLinSolver[3])();
    if ((double)iVar4 <= (double)this->nzCount * this->lastFill) {
      if (this->lastNzCount < this->nzCount) {
        pSVar5 = this->spxout;
        if ((pSVar5 == (SPxOut *)0x0) || ((int)pSVar5->m_verbosity < 5)) goto LAB_001e7da8;
        local_30[1] = 5;
        local_30[0] = pSVar5->m_verbosity;
        (*pSVar5->_vptr_SPxOut[2])();
        pSVar5 = operator<<(this->spxout,"IBASIS05 nonzero factor triggers refactorization");
        pSVar5 = operator<<(pSVar5," nzCount= ");
        std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],this->nzCount);
        pSVar5 = operator<<(pSVar5," lastNzCount= ");
        std::ostream::operator<<
                  ((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],this->lastNzCount);
        pSVar5 = operator<<(pSVar5," nonzeroFactor= ");
        dVar6 = this->nonzeroFactor;
        goto LAB_001e7d77;
      }
      if (this->updateCount < this->maxUpdates) {
        (*this->factor->_vptr_SLinSolver[9])(this->factor,(ulong)(uint)i,enterVec,eta);
        this->totalUpdateCount = this->totalUpdateCount + 1;
        iVar4 = (*this->factor->_vptr_SLinSolver[1])();
        if ((iVar4 == 0) &&
           ((*this->factor->_vptr_SLinSolver[6])(), this->minStab <= extraout_XMM0_Qa)) {
          return;
        }
        pSVar5 = this->spxout;
        if ((pSVar5 == (SPxOut *)0x0) || ((int)pSVar5->m_verbosity < 5)) goto LAB_001e7da8;
        local_30[1] = 5;
        local_30[0] = pSVar5->m_verbosity;
        (*pSVar5->_vptr_SPxOut[2])();
        pSVar5 = operator<<(this->spxout,"IBASIS07 stability triggers refactorization");
        pSVar5 = operator<<(pSVar5," stability= ");
        (*this->factor->_vptr_SLinSolver[6])();
        std::ostream::_M_insert<double>(extraout_XMM0_Qa_00);
        pSVar5 = operator<<(pSVar5," minStab= ");
        dVar6 = this->minStab;
        goto LAB_001e7d77;
      }
      pSVar5 = this->spxout;
      if ((pSVar5 == (SPxOut *)0x0) || ((int)pSVar5->m_verbosity < 5)) goto LAB_001e7da8;
      local_30[1] = 5;
      local_30[0] = pSVar5->m_verbosity;
      (*pSVar5->_vptr_SPxOut[2])();
      pSVar5 = operator<<(this->spxout,"IBASIS06 update count triggers refactorization");
      pSVar5 = operator<<(pSVar5," updateCount= ");
      std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],this->updateCount);
      pSVar5 = operator<<(pSVar5," maxUpdates= ");
      std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],this->maxUpdates);
    }
    else {
      pSVar5 = this->spxout;
      if ((pSVar5 == (SPxOut *)0x0) || ((int)pSVar5->m_verbosity < 5)) goto LAB_001e7da8;
      local_30[1] = 5;
      local_30[0] = pSVar5->m_verbosity;
      (*pSVar5->_vptr_SPxOut[2])();
      pSVar5 = operator<<(this->spxout,"IBASIS04 fill factor triggers refactorization");
      pSVar5 = operator<<(pSVar5," memory= ");
      iVar4 = (*this->factor->_vptr_SLinSolver[3])();
      std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],iVar4);
      pSVar5 = operator<<(pSVar5," nzCount= ");
      std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],this->nzCount);
      pSVar5 = operator<<(pSVar5," lastFill= ");
      dVar6 = this->lastFill;
LAB_001e7d77:
      std::ostream::_M_insert<double>(dVar6);
    }
    std::endl<char,std::char_traits<char>>(pSVar5->m_streams[pSVar5->m_verbosity]);
  }
  else {
    pSVar5 = this->spxout;
    if ((pSVar5 == (SPxOut *)0x0) || ((int)pSVar5->m_verbosity < 5)) goto LAB_001e7da8;
    local_30[1] = 5;
    local_30[0] = pSVar5->m_verbosity;
    (*pSVar5->_vptr_SPxOut[2])();
    pSVar5 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar5->m_streams[pSVar5->m_verbosity],
               "IBASIS04 memory growth factor triggers refactorization",0x36);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar5->m_streams[pSVar5->m_verbosity]," memory= ",9);
    iVar4 = (*this->factor->_vptr_SLinSolver[3])();
    std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],iVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar5->m_streams[pSVar5->m_verbosity]," lastMem= ",10);
    std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],this->lastMem);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar5->m_streams[pSVar5->m_verbosity]," memFactor= ",0xc);
    std::ostream::_M_insert<double>(this->memFactor);
    cVar3 = (char)pSVar5->m_streams[pSVar5->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar5->m_streams[pSVar5->m_verbosity] + -0x18) +
                    cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
  }
  (*this->spxout->_vptr_SPxOut[2])(this->spxout,local_30);
LAB_001e7da8:
  (*this->_vptr_SPxBasisBase[0xb])(this);
  return;
}

Assistant:

void SPxBasisBase<R>::change(
   int i,
   SPxId& id,
   const SVectorBase<R>* enterVec,
   const SSVectorBase<R>* eta)
{

   assert(matrixIsSetup);
   assert(!id.isValid() || (enterVec != nullptr));
   assert(factor != nullptr);

   lastidx = i;
   lastin  = id;

   if(id.isValid() && i >= 0)
   {
      assert(enterVec != nullptr);

      // update the counter for nonzeros in the basis matrix
      nzCount      = nzCount - matrix[i]->size() + enterVec->size();
      // let the new id enter the basis
      matrix[i]    = enterVec;
      lastout      = theBaseId[i];
      theBaseId[i] = id;

      ++iterCount;
      ++updateCount;

      SPxOut::debug(this,
                    "factor_stats: iteration= {}, update= {}, total_update= {}, nonzero_B= {}, nonzero_LU= {}, factor_fill= {}, time= {}\n",
                    this->iteration(), updateCount, totalUpdateCount, nzCount, factor->memory(), lastFill,
                    theLP->time());

      // never factorize? Just do it !
      if(!factorized)
         factorize();

      // too much memory growth ?
      else if(R(factor->memory()) > 1000 + factor->dim() + lastMem * memFactor)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) <<
                       "IBASIS04 memory growth factor triggers refactorization"
                       << " memory= " << factor->memory()
                       << " lastMem= " << lastMem
                       << " memFactor= " << memFactor
                       << std::endl;)
         factorize();
      }

      // relative fill too high ?
      else if(R(factor->memory()) > lastFill * R(nzCount))
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IBASIS04 fill factor triggers refactorization"
                       << " memory= " << factor->memory()
                       << " nzCount= " << nzCount
                       << " lastFill= " << lastFill
                       << std::endl;)

         factorize();
      }
      // absolute fill in basis matrix too high ?
      else if(nzCount > lastNzCount)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IBASIS05 nonzero factor triggers refactorization"
                       << " nzCount= " << nzCount
                       << " lastNzCount= " << lastNzCount
                       << " nonzeroFactor= " << nonzeroFactor
                       << std::endl;)
         factorize();
      }
      // too many updates ?
      else if(updateCount >= maxUpdates)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IBASIS06 update count triggers refactorization"
                       << " updateCount= " << updateCount
                       << " maxUpdates= " << maxUpdates
                       << std::endl;)
         factorize();
      }
      else
      {
         try
         {
#ifdef MEASUREUPDATETIME
            theTime.start();
#endif
            factor->change(i, *enterVec, eta);
            totalUpdateCount++;
#ifdef MEASUREUPDATETIME
            theTime.stop();
#endif
         }
         catch(...)
         {
            SPX_MSG_INFO3((*this->spxout), (*this->spxout) <<
                          "IBASIS13 problems updating factorization; refactorizing basis"
                          << std::endl;)

#ifdef MEASUREUPDATETIME
            theTime.stop();
#endif

            // singularity was detected in update; we refactorize
            factorize();

            // if factorize() detects singularity, an exception is thrown, hence at this point we have a regular basis
            // and can try the update again
            assert(status() >= SPxBasisBase<R>::REGULAR);

            try
            {
#ifdef MEASUREUPDATETIME
               theTime.start();
#endif
               factor->change(i, *enterVec, eta);
               totalUpdateCount++;
#ifdef MEASUREUPDATETIME
               theTime.stop();
#endif
            }
            // with a freshly factorized, regular basis, the update is unlikely to fail; if this happens nevertheless,
            // we have to invalidate the basis to have the statuses correct
            catch(const SPxException& F)
            {
               SPX_MSG_INFO3((*this->spxout), (*this->spxout) <<
                             "IBASIS14 problems updating factorization; invalidating factorization"
                             << std::endl;)

#ifdef MEASUREUPDATETIME
               theTime.stop();
#endif

               factorized = false;
               throw F;
            }
         }

         assert(minStab > 0.0);

         if(factor->status() != SLinSolver<R>::OK || factor->stability() < minStab)
         {
            SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IBASIS07 stability triggers refactorization"
                          << " stability= " << factor->stability()
                          << " minStab= " << minStab
                          << std::endl;)
            factorize();
         }
      }
   }
   else
      lastout = id;
}